

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_JUnitOutputTest_MultipleTestCaseBlocksWithAssertions_Test::
~TEST_JUnitOutputTest_MultipleTestCaseBlocksWithAssertions_Test
          (TEST_JUnitOutputTest_MultipleTestCaseBlocksWithAssertions_Test *this)

{
  TEST_JUnitOutputTest_MultipleTestCaseBlocksWithAssertions_Test *this_local;
  
  ~TEST_JUnitOutputTest_MultipleTestCaseBlocksWithAssertions_Test(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST(JUnitOutputTest, MultipleTestCaseBlocksWithAssertions)
{
    testCaseRunner->start()
            .withGroup("twoTestsGroup")
            .withTest("firstTestName").thatHasChecks(456)
            .withTest("secondTestName").thatHasChecks(567)
            .end();

    outputFile = fileSystem.file("cpputest_twoTestsGroup.xml");

    STRCMP_EQUAL("<testcase classname=\"twoTestsGroup\" name=\"firstTestName\" assertions=\"456\" time=\"0.000\" file=\"file\" line=\"1\">\n", outputFile->line(5));
    STRCMP_EQUAL("<testcase classname=\"twoTestsGroup\" name=\"secondTestName\" assertions=\"567\" time=\"0.000\" file=\"file\" line=\"1\">\n", outputFile->line(7));
}